

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,uint8 *target,EpsCopyOutputStream *stream)

{
  Arena *pAVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *other;
  uint8 *puVar4;
  uint uVar5;
  uint8 *extraout_RDX;
  uint8 *puVar6;
  uint8 *puVar7;
  undefined4 in_register_00000034;
  LogFinisher local_61;
  LogMessage local_60;
  
  puVar4 = (uint8 *)CONCAT44(in_register_00000034,number);
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      puVar6 = target;
      if (stream->end_ <= target) {
        puVar4 = target;
        puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        target = extraout_RDX;
      }
      puVar6[0] = '\v';
      puVar6[1] = '\x10';
      if ((uint)number < 0x80) {
        puVar6[2] = (byte)number;
        puVar6 = puVar6 + 3;
      }
      else {
        puVar6[2] = (byte)number | 0x80;
        if ((uint)number < 0x4000) {
          puVar6[3] = (uint8)((uint)number >> 7);
          puVar6 = puVar6 + 4;
        }
        else {
          puVar6 = puVar6 + 4;
          uVar3 = (uint)number >> 7;
          do {
            puVar7 = puVar6;
            target = (uint8 *)((ulong)uVar3 | 0x80);
            puVar7[-1] = (uint8)target;
            uVar5 = uVar3 >> 7;
            puVar6 = puVar7 + 1;
            bVar2 = 0x3fff < uVar3;
            uVar3 = uVar5;
          } while (bVar2);
          *puVar7 = (uint8)uVar5;
        }
      }
      pAVar1 = (Arena *)(this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        *puVar6 = '\x1a';
        uVar3 = (*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].cleanup_)
                          (pAVar1,puVar4,(uint64)target);
        if (uVar3 < 0x80) {
          puVar6[1] = (byte)uVar3;
          puVar6 = puVar6 + 2;
        }
        else {
          puVar6[1] = (byte)uVar3 | 0x80;
          if (uVar3 < 0x4000) {
            puVar6[2] = (uint8)(uVar3 >> 7);
            puVar6 = puVar6 + 3;
          }
          else {
            puVar6 = puVar6 + 3;
            uVar3 = uVar3 >> 7;
            do {
              puVar4 = puVar6;
              puVar4[-1] = (byte)uVar3 | 0x80;
              uVar5 = uVar3 >> 7;
              puVar6 = puVar4 + 1;
              bVar2 = 0x3fff < uVar3;
              uVar3 = uVar5;
            } while (bVar2);
            *puVar4 = (uint8)uVar5;
          }
        }
        puVar4 = (uint8 *)(*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].ptr_)
                                    (pAVar1,puVar6,stream);
      }
      else {
        puVar4 = (uint8 *)(*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].cleanup_limit_)
                                    (pAVar1,3,puVar6,stream);
      }
      if (stream->end_ <= puVar4) {
        puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      }
      *puVar4 = '\f';
      target = puVar4 + 1;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x81f);
    other = LogMessage::operator<<(&local_60,"Invalid message set extension.");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,target,stream);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, uint8* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, target, stream);
  }

  if (is_cleared) return target;

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->WriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, target,
        stream);
  }
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}